

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O3

void __thiscall Kvm::initialize(Kvm *this)

{
  Kgc *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Value *pVVar2;
  string local_38;
  
  this_00 = &this->gc_;
  pVVar2 = Kgc::allocValue(this_00,NIL);
  this->NIL = pVVar2;
  Kgc::pushStackRoot(this_00,pVVar2);
  pVVar2 = Kgc::allocValue(this_00,BOOLEAN);
  *(undefined1 *)&pVVar2[1]._vptr_Value = 0;
  this->FALSE = pVVar2;
  Kgc::pushStackRoot(this_00,pVVar2);
  pVVar2 = Kgc::allocValue(this_00,BOOLEAN);
  *(undefined1 *)&pVVar2[1]._vptr_Value = 1;
  this->TRUE = pVVar2;
  Kgc::pushStackRoot(this_00,pVVar2);
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"quote","");
  pVVar2 = makeSymbol(this,&local_38);
  this->QUOTE = pVVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    pVVar2 = this->QUOTE;
  }
  Kgc::pushStackRoot(this_00,pVVar2);
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"define","");
  pVVar2 = makeSymbol(this,&local_38);
  this->DEFINE = pVVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    pVVar2 = this->DEFINE;
  }
  Kgc::pushStackRoot(this_00,pVVar2);
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"set!","");
  pVVar2 = makeSymbol(this,&local_38);
  this->SET = pVVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    pVVar2 = this->SET;
  }
  Kgc::pushStackRoot(this_00,pVVar2);
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"ok","");
  pVVar2 = makeSymbol(this,&local_38);
  this->OK = pVVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    pVVar2 = this->OK;
  }
  Kgc::pushStackRoot(this_00,pVVar2);
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"if","");
  pVVar2 = makeSymbol(this,&local_38);
  this->IF = pVVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    pVVar2 = this->IF;
  }
  Kgc::pushStackRoot(this_00,pVVar2);
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"lambda","");
  pVVar2 = makeSymbol(this,&local_38);
  this->LAMBDA = pVVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    pVVar2 = this->LAMBDA;
  }
  Kgc::pushStackRoot(this_00,pVVar2);
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"begin","");
  pVVar2 = makeSymbol(this,&local_38);
  this->BEGIN = pVVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    pVVar2 = this->BEGIN;
  }
  Kgc::pushStackRoot(this_00,pVVar2);
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"cond","");
  pVVar2 = makeSymbol(this,&local_38);
  this->COND = pVVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    pVVar2 = this->COND;
  }
  Kgc::pushStackRoot(this_00,pVVar2);
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"else","");
  pVVar2 = makeSymbol(this,&local_38);
  this->ELSE = pVVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    pVVar2 = this->ELSE;
  }
  Kgc::pushStackRoot(this_00,pVVar2);
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"let","");
  pVVar2 = makeSymbol(this,&local_38);
  this->LET = pVVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    pVVar2 = this->LET;
  }
  Kgc::pushStackRoot(this_00,pVVar2);
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"and","");
  pVVar2 = makeSymbol(this,&local_38);
  this->AND = pVVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    pVVar2 = this->AND;
  }
  Kgc::pushStackRoot(this_00,pVVar2);
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"or","");
  pVVar2 = makeSymbol(this,&local_38);
  this->OR = pVVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    pVVar2 = this->OR;
  }
  Kgc::pushStackRoot(this_00,pVVar2);
  pVVar2 = Kgc::allocValue(this_00,EOF_OBJECT);
  pVVar2->type_ = EOF_OBJECT;
  this->EOFOBJ = pVVar2;
  Kgc::pushStackRoot(this_00,pVVar2);
  this->EMPTY_ENV = this->NIL;
  pVVar2 = makeEnvironment(this);
  this->GLOBAL_ENV = pVVar2;
  Kgc::pushStackRoot(this_00,pVVar2);
  return;
}

Assistant:

void Kvm::initialize()
{
    NIL   = makeNil();
    GC_PROTECT(NIL);
    
    FALSE = makeBool(false);
    GC_PROTECT(FALSE);
    
    TRUE  = makeBool(true);
    GC_PROTECT(TRUE);
    
    QUOTE = makeSymbol("quote");
    GC_PROTECT(QUOTE);
    
    DEFINE= makeSymbol("define");
    GC_PROTECT(DEFINE);
    
    SET   = makeSymbol("set!");
    GC_PROTECT(SET);
    
    OK    = makeSymbol("ok");
    GC_PROTECT(OK);
    
    IF    = makeSymbol("if");
    GC_PROTECT(IF);
    
    LAMBDA= makeSymbol("lambda");
    GC_PROTECT(LAMBDA);
    
    BEGIN = makeSymbol("begin");
    GC_PROTECT(BEGIN);
    
    COND  = makeSymbol("cond");
    GC_PROTECT(COND);
    
    ELSE  = makeSymbol("else");
    GC_PROTECT(ELSE);
    
    LET   = makeSymbol("let");
    GC_PROTECT(LET);
    
    AND   = makeSymbol("and");
    GC_PROTECT(AND);
    
    OR    = makeSymbol("or");
    GC_PROTECT(OR);
    
    EOFOBJ= makeEofObject();
    GC_PROTECT(EOFOBJ);
    
    EMPTY_ENV = NIL; // already protected
    GLOBAL_ENV= makeEnvironment();
    GC_PROTECT(GLOBAL_ENV);
}